

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderControlStatementTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::ShaderControlStatementTests::init
          (ShaderControlStatementTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *pTVar2;
  ulong extraout_RAX;
  ShaderPerformanceCaseGroup *pSVar3;
  ConditionalCase *this_00;
  char *pcVar4;
  ConditionalWorkloadReferenceCase *pCVar5;
  ShaderPerformanceCase *perfCase;
  ulong uVar6;
  LoopCase *pLVar7;
  LoopWorkloadReferenceCase *pLVar8;
  bool isVertex_00;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_17a;
  allocator<char> local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char *local_138;
  char *decisionName_1;
  ShaderPerformanceCaseGroup *pSStack_128;
  int decisionType_1;
  ShaderPerformanceCaseGroup *vertexOrFragmentGroup_1;
  bool isVertex_1;
  TestNode *pTStack_118;
  int isFrag_1;
  TestCaseGroup *currentLoopGroup;
  int groupNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string caseName;
  char *branchResultName;
  int branchResult;
  char *workloadDivisionSuffix;
  int workloadDivision;
  char *decisionName;
  int decisionType;
  ShaderPerformanceCaseGroup *vertexOrFragmentGroup;
  uint local_28;
  bool isVertex;
  int isFrag;
  TestCaseGroup *ifElseGroup;
  ShaderControlStatementTests *this_local;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"if_else",
             "if-else Conditional Performance Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_28 = 0;
  uVar6 = extraout_RAX;
  while ((int)local_28 < 2) {
    isVertex_00 = local_28 == 0;
    pSVar3 = (ShaderPerformanceCaseGroup *)operator_new(0x80);
    pcVar4 = "Vertex and fragment";
    if (isVertex_00) {
      pcVar4 = "Unexpected vertex";
    }
    deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
              (pSVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               pcVar4 + 0xb,"");
    tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar3);
    for (decisionName._4_4_ = DECISION_STATIC; (int)decisionName._4_4_ < 3;
        decisionName._4_4_ = decisionName._4_4_ + DECISION_UNIFORM) {
      if (decisionName._4_4_ == DECISION_STATIC) {
        local_1e8 = "static";
      }
      else {
        if (decisionName._4_4_ == DECISION_UNIFORM) {
          local_1f0 = "uniform";
        }
        else {
          if (decisionName._4_4_ == DECISION_ATTRIBUTE) {
            local_1f8 = "varying";
            if (isVertex_00) {
              local_1f8 = "attribute";
            }
          }
          else {
            local_1f8 = (char *)0x0;
          }
          local_1f0 = local_1f8;
        }
        local_1e8 = local_1f0;
      }
      for (workloadDivisionSuffix._4_4_ = WORKLOAD_DIVISION_EVEN;
          (int)workloadDivisionSuffix._4_4_ < 3;
          workloadDivisionSuffix._4_4_ = workloadDivisionSuffix._4_4_ + WORKLOAD_DIVISION_TRUE_HEAVY
          ) {
        if (workloadDivisionSuffix._4_4_ == WORKLOAD_DIVISION_EVEN) {
          local_200 = "";
        }
        else {
          if (workloadDivisionSuffix._4_4_ == WORKLOAD_DIVISION_TRUE_HEAVY) {
            local_208 = "_with_heavier_true";
          }
          else {
            local_208 = (char *)0x0;
            if (workloadDivisionSuffix._4_4_ == WORKLOAD_DIVISION_FALSE_HEAVY) {
              local_208 = "_with_heavier_false";
            }
          }
          local_200 = local_208;
        }
        for (branchResultName._4_4_ = BRANCH_TRUE; (int)branchResultName._4_4_ < 3;
            branchResultName._4_4_ = branchResultName._4_4_ + BRANCH_FALSE) {
          if ((decisionName._4_4_ == DECISION_ATTRIBUTE) || (branchResultName._4_4_ != BRANCH_MIXED)
             ) {
            if (branchResultName._4_4_ == BRANCH_TRUE) {
              local_210 = "true";
            }
            else {
              if (branchResultName._4_4_ == BRANCH_FALSE) {
                local_218 = "false";
              }
              else {
                local_218 = (char *)0x0;
                if (branchResultName._4_4_ == BRANCH_MIXED) {
                  local_218 = "mixed";
                }
              }
              local_210 = local_218;
            }
            caseName.field_2._8_8_ = local_210;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&groupNdx,"",(allocator<char> *)((long)&currentLoopGroup + 7));
            std::operator+(&local_e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &groupNdx,local_1e8);
            std::operator+(&local_c8,&local_e8,"_");
            std::operator+(&local_a8,&local_c8,(char *)caseName.field_2._8_8_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,&local_a8,local_200);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&groupNdx);
            std::allocator<char>::~allocator((allocator<char> *)((long)&currentLoopGroup + 7));
            this_00 = (ConditionalCase *)operator_new(0x1f0);
            pCVar1 = (this->super_TestCaseGroup).m_context;
            pcVar4 = (char *)std::__cxx11::string::c_str();
            ConditionalCase::ConditionalCase
                      (this_00,pCVar1,pcVar4,"",decisionName._4_4_,branchResultName._4_4_,
                       workloadDivisionSuffix._4_4_,isVertex_00);
            deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)this_00)
            ;
            std::__cxx11::string::~string((string *)local_88);
          }
        }
      }
    }
    if (isVertex_00) {
      pCVar5 = (ConditionalWorkloadReferenceCase *)operator_new(0x1c8);
      ConditionalWorkloadReferenceCase::ConditionalWorkloadReferenceCase
                (pCVar5,(this->super_TestCaseGroup).m_context,"reference","",true,isVertex_00);
      deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pCVar5);
    }
    else {
      pCVar5 = (ConditionalWorkloadReferenceCase *)operator_new(0x1c8);
      ConditionalWorkloadReferenceCase::ConditionalWorkloadReferenceCase
                (pCVar5,(this->super_TestCaseGroup).m_context,"reference_unmixed","",true,
                 isVertex_00);
      deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pCVar5);
      pCVar5 = (ConditionalWorkloadReferenceCase *)operator_new(0x1c8);
      ConditionalWorkloadReferenceCase::ConditionalWorkloadReferenceCase
                (pCVar5,(this->super_TestCaseGroup).m_context,"reference_mixed","",false,isVertex_00
                );
      deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pCVar5);
    }
    perfCase = (ShaderPerformanceCase *)operator_new(0x1c0);
    EmptyWorkloadReferenceCase::EmptyWorkloadReferenceCase
              ((EmptyWorkloadReferenceCase *)perfCase,(this->super_TestCaseGroup).m_context,
               "reference_empty","",isVertex_00);
    deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,perfCase);
    local_28 = local_28 + 1;
    uVar6 = (ulong)local_28;
  }
  currentLoopGroup._0_4_ = 0;
  while ((int)(uint)currentLoopGroup < 3) {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::loopGroups[(int)(uint)currentLoopGroup].name,
               init::loopGroups[(int)(uint)currentLoopGroup].description);
    pTStack_118 = pTVar2;
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    for (vertexOrFragmentGroup_1._4_4_ = 0; vertexOrFragmentGroup_1._4_4_ < 2;
        vertexOrFragmentGroup_1._4_4_ = vertexOrFragmentGroup_1._4_4_ + 1) {
      vertexOrFragmentGroup_1._3_1_ = vertexOrFragmentGroup_1._4_4_ == 0;
      pSVar3 = (ShaderPerformanceCaseGroup *)operator_new(0x80);
      pcVar4 = "Vertex and fragment";
      if ((vertexOrFragmentGroup_1._3_1_ & 1) != 0) {
        pcVar4 = "Unexpected vertex";
      }
      deqp::gls::ShaderPerformanceCaseGroup::ShaderPerformanceCaseGroup
                (pSVar3,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 pcVar4 + 0xb,"");
      pSStack_128 = pSVar3;
      tcu::TestNode::addChild(pTStack_118,(TestNode *)pSVar3);
      for (decisionName_1._4_4_ = DECISION_STATIC; pSVar3 = pSStack_128,
          (int)decisionName_1._4_4_ < 3;
          decisionName_1._4_4_ = decisionName_1._4_4_ + DECISION_UNIFORM) {
        if (decisionName_1._4_4_ == DECISION_STATIC) {
          local_290 = "static";
        }
        else {
          if (decisionName_1._4_4_ == DECISION_UNIFORM) {
            local_298 = "uniform";
          }
          else {
            if (decisionName_1._4_4_ == DECISION_ATTRIBUTE) {
              local_2a0 = "varying";
              if ((vertexOrFragmentGroup_1._3_1_ & 1) != 0) {
                local_2a0 = "attribute";
              }
            }
            else {
              local_2a0 = (char *)0x0;
            }
            local_298 = local_2a0;
          }
          local_290 = local_298;
        }
        local_138 = local_290;
        if (decisionName_1._4_4_ == DECISION_ATTRIBUTE) {
          pLVar7 = (LoopCase *)operator_new(0x1f0);
          pcVar4 = local_138;
          local_17a = 1;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,pcVar4,&local_179)
          ;
          std::operator+(&local_158,&local_178,"_stable");
          pcVar4 = (char *)std::__cxx11::string::c_str();
          LoopCase::LoopCase(pLVar7,pCVar1,pcVar4,"",
                             init::loopGroups[(int)(uint)currentLoopGroup].type,decisionName_1._4_4_
                             ,true,(bool)(vertexOrFragmentGroup_1._3_1_ & 1));
          local_17a = 0;
          deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pLVar7);
          std::__cxx11::string::~string((string *)&local_158);
          std::__cxx11::string::~string((string *)&local_178);
          std::allocator<char>::~allocator(&local_179);
          pSVar3 = pSStack_128;
          pLVar7 = (LoopCase *)operator_new(0x1f0);
          pcVar4 = local_138;
          pCVar1 = (this->super_TestCaseGroup).m_context;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,pcVar4,&local_1c1)
          ;
          std::operator+(&local_1a0,&local_1c0,"_unstable");
          pcVar4 = (char *)std::__cxx11::string::c_str();
          LoopCase::LoopCase(pLVar7,pCVar1,pcVar4,"",
                             init::loopGroups[(int)(uint)currentLoopGroup].type,decisionName_1._4_4_
                             ,false,(bool)(vertexOrFragmentGroup_1._3_1_ & 1));
          deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pLVar7);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_1c0);
          std::allocator<char>::~allocator(&local_1c1);
        }
        else {
          pLVar7 = (LoopCase *)operator_new(0x1f0);
          LoopCase::LoopCase(pLVar7,(this->super_TestCaseGroup).m_context,local_138,"",
                             init::loopGroups[(int)(uint)currentLoopGroup].type,decisionName_1._4_4_
                             ,true,(bool)(vertexOrFragmentGroup_1._3_1_ & 1));
          deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pLVar7);
        }
      }
      if ((vertexOrFragmentGroup_1._3_1_ & 1) == 0) {
        pLVar8 = (LoopWorkloadReferenceCase *)operator_new(0x1c8);
        LoopWorkloadReferenceCase::LoopWorkloadReferenceCase
                  (pLVar8,(this->super_TestCaseGroup).m_context,"reference_stable","",true,
                   (bool)(vertexOrFragmentGroup_1._3_1_ & 1));
        deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pLVar8);
        pSVar3 = pSStack_128;
        pLVar8 = (LoopWorkloadReferenceCase *)operator_new(0x1c8);
        LoopWorkloadReferenceCase::LoopWorkloadReferenceCase
                  (pLVar8,(this->super_TestCaseGroup).m_context,"reference_unstable","",false,
                   (bool)(vertexOrFragmentGroup_1._3_1_ & 1));
        deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pLVar8);
      }
      else {
        pLVar8 = (LoopWorkloadReferenceCase *)operator_new(0x1c8);
        LoopWorkloadReferenceCase::LoopWorkloadReferenceCase
                  (pLVar8,(this->super_TestCaseGroup).m_context,"reference","",true,
                   (bool)(vertexOrFragmentGroup_1._3_1_ & 1));
        deqp::gls::ShaderPerformanceCaseGroup::addChild(pSVar3,(ShaderPerformanceCase *)pLVar8);
      }
    }
    currentLoopGroup._0_4_ = (uint)currentLoopGroup + 1;
    uVar6 = (ulong)(uint)currentLoopGroup;
  }
  return (int)uVar6;
}

Assistant:

void ShaderControlStatementTests::init (void)
{
	// Conditional cases (if-else).

	tcu::TestCaseGroup* ifElseGroup = new tcu::TestCaseGroup(m_testCtx, "if_else", "if-else Conditional Performance Tests");
	addChild(ifElseGroup);

	for (int isFrag = 0; isFrag <= 1; isFrag++)
	{
		bool isVertex = isFrag == 0;
		ShaderPerformanceCaseGroup* vertexOrFragmentGroup = new ShaderPerformanceCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
		ifElseGroup->addChild(vertexOrFragmentGroup);

		DE_STATIC_ASSERT(DECISION_STATIC == 0);
		for (int decisionType = (int)DECISION_STATIC; decisionType < (int)DECISION_LAST; decisionType++)
		{
			const char* decisionName = decisionType == (int)DECISION_STATIC		? "static" :
										decisionType == (int)DECISION_UNIFORM	? "uniform" :
										decisionType == (int)DECISION_ATTRIBUTE	? (isVertex ? "attribute" : "varying") :
																					DE_NULL;
			DE_ASSERT(decisionName != DE_NULL);

			for (int workloadDivision = 0; workloadDivision < ConditionalCase::WORKLOAD_DIVISION_LAST; workloadDivision++)
			{
				const char* workloadDivisionSuffix = workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_EVEN			? "" :
													 workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_TRUE_HEAVY		? "_with_heavier_true" :
													 workloadDivision == (int)ConditionalCase::WORKLOAD_DIVISION_FALSE_HEAVY	? "_with_heavier_false" :
																																  DE_NULL;
				DE_ASSERT(workloadDivisionSuffix != DE_NULL);

				DE_STATIC_ASSERT(ConditionalCase::BRANCH_TRUE == 0);
				for (int branchResult = (int)ConditionalCase::BRANCH_TRUE; branchResult < (int)ConditionalCase::BRANCH_LAST; branchResult++)
				{
					if (decisionType != (int)DECISION_ATTRIBUTE && branchResult == (int)ConditionalCase::BRANCH_MIXED)
						continue;

					const char* branchResultName = branchResult == (int)ConditionalCase::BRANCH_TRUE	? "true" :
												   branchResult == (int)ConditionalCase::BRANCH_FALSE	? "false" :
												   branchResult == (int)ConditionalCase::BRANCH_MIXED	? "mixed" :
																										  DE_NULL;
					DE_ASSERT(branchResultName != DE_NULL);

					string caseName = string("") + decisionName + "_" + branchResultName + workloadDivisionSuffix;

					vertexOrFragmentGroup->addChild(new ConditionalCase(m_context, caseName.c_str(), "",
																		(DecisionType)decisionType, (ConditionalCase::BranchResult)branchResult,
																		(ConditionalCase::WorkloadDivision)workloadDivision, isVertex));
				}
			}
		}

		if (isVertex)
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference", "", true, isVertex));
		else
		{
			// Only fragment case with BRANCH_MIXED has an additional fract() call.
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference_unmixed", "", true, isVertex));
			vertexOrFragmentGroup->addChild(new ConditionalWorkloadReferenceCase(m_context, "reference_mixed", "", false, isVertex));
		}

		vertexOrFragmentGroup->addChild(new EmptyWorkloadReferenceCase(m_context, "reference_empty", "", isVertex));
	}

	// Loop cases.

	static const struct
	{
		LoopCase::LoopType	type;
		const char*			name;
		const char*			description;
	} loopGroups[] =
	{
		{LoopCase::LOOP_FOR,		"for",		"for Loop Performance Tests"},
		{LoopCase::LOOP_WHILE,		"while",	"while Loop Performance Tests"},
		{LoopCase::LOOP_DO_WHILE,	"do_while",	"do-while Loop Performance Tests"}
	};

	for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(loopGroups); groupNdx++)
	{
		tcu::TestCaseGroup* currentLoopGroup = new tcu::TestCaseGroup(m_testCtx, loopGroups[groupNdx].name, loopGroups[groupNdx].description);
		addChild(currentLoopGroup);

		for (int isFrag = 0; isFrag <= 1; isFrag++)
		{
			bool isVertex = isFrag == 0;
			ShaderPerformanceCaseGroup* vertexOrFragmentGroup = new ShaderPerformanceCaseGroup(m_testCtx, isVertex ? "vertex" : "fragment", "");
			currentLoopGroup->addChild(vertexOrFragmentGroup);

			DE_STATIC_ASSERT(DECISION_STATIC == 0);
			for (int decisionType = (int)DECISION_STATIC; decisionType < (int)DECISION_LAST; decisionType++)
			{
				const char* decisionName = decisionType == (int)DECISION_STATIC		? "static" :
										   decisionType == (int)DECISION_UNIFORM	? "uniform" :
										   decisionType == (int)DECISION_ATTRIBUTE	? (isVertex ? "attribute" : "varying") :
																					  DE_NULL;
				DE_ASSERT(decisionName != DE_NULL);

				if (decisionType == (int)DECISION_ATTRIBUTE)
				{
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, (string(decisionName) + "_stable").c_str(), "", loopGroups[groupNdx].type, (DecisionType)decisionType, true, isVertex));
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, (string(decisionName) + "_unstable").c_str(), "", loopGroups[groupNdx].type, (DecisionType)decisionType, false, isVertex));
				}
				else
					vertexOrFragmentGroup->addChild(new LoopCase(m_context, decisionName, "", loopGroups[groupNdx].type, (DecisionType)decisionType, true, isVertex));

			}

			if (isVertex)
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference", "", true, isVertex));
			else
			{
				// Only fragment case with unstable attribute has an additional fract() call.
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference_stable", "", true, isVertex));
				vertexOrFragmentGroup->addChild(new LoopWorkloadReferenceCase(m_context, "reference_unstable", "", false, isVertex));
			}
		}
	}
}